

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O3

void __thiscall cmComputeLinkDepends::LinkEntry::LinkEntry(LinkEntry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pcVar5;
  uint7 uStack_37;
  undefined8 uStack_30;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_28;
  
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_28);
  paVar1 = &(this->Item).Value.field_2;
  (this->Item).Value._M_dataplus._M_p = (pointer)paVar1;
  paVar1->_M_allocated_capacity = (ulong)uStack_37 << 8;
  *(undefined8 *)((long)&(this->Item).Value.field_2 + 8) = uStack_30;
  (this->Item).Value._M_string_length = 0;
  uVar3 = local_28.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._0_4_;
  uVar4 = local_28.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_28.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr._0_4_;
  *(undefined4 *)
   ((long)&(this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr + 4) =
       local_28.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr._4_4_;
  *(undefined4 *)
   &(this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = uVar3;
  *(undefined4 *)
   ((long)&(this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 4) = uVar4;
  _Var2 = DEFAULT_abi_cxx11_._M_dataplus;
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  pcVar5 = DEFAULT_abi_cxx11_._M_dataplus._M_p + DEFAULT_abi_cxx11_._M_string_length;
  this->Target = (cmGeneratorTarget *)0x0;
  this->Kind = Library;
  (this->Feature)._M_dataplus._M_p = (pointer)&(this->Feature).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->Feature,_Var2._M_p,pcVar5);
  return;
}

Assistant:

LinkEntry() = default;